

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void __thiscall CServer::InitRconPasswordIfUnset(CServer *this)

{
  ushort uVar1;
  size_t i;
  long lVar2;
  long in_FS_OFFSET;
  char aRandomPassword [7];
  unsigned_short aRandom [3];
  char local_25 [7];
  ushort local_1e [3];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_RconPasswordSet == 0) {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/server/server.cpp"
                   ,0x1cb,1,"need at least 2048 possibilities for 2-character sequences");
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/server/server.cpp"
                   ,0x1ce,1,"need an even password length");
    local_25[6] = 0;
    secure_random_fill(local_1e,6);
    lVar2 = 0;
    do {
      uVar1 = local_1e[lVar2];
      *(char *)((long)local_1e + lVar2 * 2 + -7) =
           "ABCDEFGHKLMNPRSTUVWXYZabcdefghjkmnopqt23456789"[(ulong)(uVar1 & 0x7ff) / 0x2e];
      *(char *)(local_1e + lVar2 + -3) =
           "ABCDEFGHKLMNPRSTUVWXYZabcdefghjkmnopqt23456789"[(ulong)(uVar1 & 0x7ff) % 0x2e];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    str_copy(this->m_pConfig->m_SvRconPassword,local_25,0x20);
    this->m_GeneratedRconPassword = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CServer::InitRconPasswordIfUnset()
{
	if(m_RconPasswordSet)
	{
		return;
	}

	static const char VALUES[] = "ABCDEFGHKLMNPRSTUVWXYZabcdefghjkmnopqt23456789";
	static const size_t NUM_VALUES = sizeof(VALUES) - 1; // Disregard the '\0'.
	static const size_t PASSWORD_LENGTH = 6;
	dbg_assert(NUM_VALUES * NUM_VALUES >= 2048, "need at least 2048 possibilities for 2-character sequences");
	// With 6 characters, we get a password entropy of log(2048) * 6/2 = 33bit.

	dbg_assert(PASSWORD_LENGTH % 2 == 0, "need an even password length");
	unsigned short aRandom[PASSWORD_LENGTH / 2];
	char aRandomPassword[PASSWORD_LENGTH+1];
	aRandomPassword[PASSWORD_LENGTH] = 0;

	secure_random_fill(aRandom, sizeof(aRandom));
	for(size_t i = 0; i < PASSWORD_LENGTH / 2; i++)
	{
		unsigned short RandomNumber = aRandom[i] % 2048;
		aRandomPassword[2 * i + 0] = VALUES[RandomNumber / NUM_VALUES];
		aRandomPassword[2 * i + 1] = VALUES[RandomNumber % NUM_VALUES];
	}

	str_copy(Config()->m_SvRconPassword, aRandomPassword, sizeof(Config()->m_SvRconPassword));
	m_GeneratedRconPassword = 1;
}